

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O0

int __thiscall
CVmObjVector::get_minmax
          (CVmObjVector *this,vm_obj_id_t self,vm_val_t *retval,uint *in_argc,vm_rcdesc *rc,
          int sense,int want_index)

{
  anon_union_8_8_cb74652f_for_val aVar1;
  int iVar2;
  int iVar3;
  vm_val_t *pvVar4;
  size_t sVar5;
  int *in_RCX;
  vm_val_t *in_RDX;
  vm_obj_id_t in_ESI;
  vm_val_t *in_RDI;
  int in_R9D;
  int in_stack_00000008;
  int cmp;
  vm_val_t ele;
  int i;
  vm_val_t winner;
  int winner_idx;
  int cnt;
  vm_val_t *cb;
  uint argc;
  undefined4 in_stack_ffffffffffffff68;
  int iVar6;
  int iVar7;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  vm_val_t *in_stack_ffffffffffffff80;
  anon_union_8_8_cb74652f_for_val in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  vm_val_t *local_68;
  anon_union_8_8_cb74652f_for_val local_60;
  int local_58;
  vm_val_t *local_50;
  
  if (in_RCX == (int *)0x0) {
    iVar6 = 0;
  }
  else {
    iVar6 = *in_RCX;
  }
  iVar7 = iVar6;
  if ((get_minmax(unsigned_int,vm_val_t*,unsigned_int*,vm_rcdesc_const*,int,int)::desc == '\0') &&
     (iVar3 = __cxa_guard_acquire(&get_minmax(unsigned_int,vm_val_t*,unsigned_int*,vm_rcdesc_const*,int,int)
                                   ::desc), iVar3 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&get_minmax::desc,0,1);
    __cxa_guard_release(&get_minmax(unsigned_int,vm_val_t*,unsigned_int*,vm_rcdesc_const*,int,int)::
                         desc);
  }
  iVar3 = CVmObject::get_prop_check_argc
                    ((vm_val_t *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                     &in_RDI->typ,(CVmNativeCodeDesc *)CONCAT44(iVar7,in_stack_ffffffffffffff68));
  if (iVar3 == 0) {
    local_50 = (vm_val_t *)0x0;
    if (iVar6 != 0) {
      local_50 = CVmStack::get(0);
      iVar3 = vm_val_t::is_func_ptr(in_stack_ffffffffffffff80);
      if (iVar3 == 0) {
        err_throw(0);
      }
    }
    pvVar4 = CVmStack::push();
    vm_val_t::set_obj(pvVar4,in_ESI);
    sVar5 = get_element_count((CVmObjVector *)0x34ffed);
    if ((int)sVar5 == 0) {
      err_throw(0);
    }
    local_58 = 0;
    for (iVar3 = 0; iVar3 < (int)sVar5; iVar3 = iVar3 + 1) {
      get_element((CVmObjVector *)in_RDI,CONCAT44(iVar7,in_stack_ffffffffffffff68),
                  (vm_val_t *)0x350034);
      if (local_50 != (vm_val_t *)0x0) {
        CVmStack::push((vm_val_t *)&stack0xffffffffffffff80);
        CVmRun::call_func_ptr
                  ((CVmRun *)CONCAT44(iVar3,in_stack_ffffffffffffff90),
                   (vm_val_t *)in_stack_ffffffffffffff88.native_desc,
                   (uint)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                   (vm_rcdesc *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                   (uint)((ulong)in_RDI >> 0x20));
        pvVar4 = CVmRun::get_r0();
        in_stack_ffffffffffffff80 = *(vm_val_t **)pvVar4;
        in_stack_ffffffffffffff88 = pvVar4->val;
      }
      pvVar4 = in_stack_ffffffffffffff80;
      aVar1 = in_stack_ffffffffffffff88;
      iVar2 = iVar3;
      if ((iVar3 != 0) &&
         (((in_stack_ffffffffffffff7c =
                 vm_val_t::compare_to
                           ((vm_val_t *)
                            CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),in_RDI),
           0 < in_R9D && (0 < in_stack_ffffffffffffff7c)) ||
          ((pvVar4 = local_68, aVar1 = local_60, iVar2 = local_58, in_R9D < 0 &&
           (in_stack_ffffffffffffff7c < 0)))))) {
        pvVar4 = in_stack_ffffffffffffff80;
        aVar1 = in_stack_ffffffffffffff88;
        iVar2 = iVar3;
      }
      local_58 = iVar2;
      local_60 = aVar1;
      local_68 = pvVar4;
    }
    CVmStack::discard(iVar6 + 1);
    if (in_stack_00000008 == 0) {
      *(vm_val_t **)in_RDX = local_68;
      in_RDX->val = local_60;
    }
    else {
      vm_val_t::set_int(in_RDX,local_58 + 1);
    }
  }
  return 1;
}

Assistant:

int CVmObjVector::get_minmax(VMG_ vm_obj_id_t self, vm_val_t *retval,
                             uint *in_argc, const vm_rcdesc *rc,
                             int sense, int want_index)
{
    /* check arguments */
    uint argc = (in_argc == 0 ? 0 : *in_argc);
    static CVmNativeCodeDesc desc(0, 1);
    if (get_prop_check_argc(retval, in_argc, &desc))
        return TRUE;

    /* make sure the 'func' argument is valid */
    const vm_val_t *cb = 0;
    if (argc >= 1)
    {
        cb = G_stk->get(0);
        if (!cb->is_func_ptr(vmg0_))
            err_throw(VMERR_BAD_TYPE_BIF);
    }

    /* push 'self' for gc protection */
    G_stk->push()->set_obj(self);

    /* if there are no elements, this is an error */
    int cnt = get_element_count();
    if (cnt == 0)
        err_throw(VMERR_BAD_VAL_BIF);

    /* we don't have a winner yet */
    int winner_idx = 0;
    vm_val_t winner;

    /* run through the list */
    for (int i = 0 ; i < cnt ; ++i)
    {
        /* get this element */
        vm_val_t ele;
        get_element(i, &ele);

        /* if there's a callback, invoke it */
        if (cb != 0)
        {
            /* invoke the callback with the element value as the argument */
            G_stk->push(&ele);
            G_interpreter->call_func_ptr(vmg_ cb, 1, rc, 0);

            /* use the result as the comparison value */
            ele = *G_interpreter->get_r0();
        }

        /* compare it to the winner so far, and keep the lower value */
        if (i == 0)
        {
            /* it's the first element, so it's the default winner so far */
            winner_idx = i;
            winner = ele;
        }
        else
        {
            /* compare it to the winner so far */
            int cmp = ele.compare_to(vmg_ &winner);

            /* keep it if it's the min/max so far */
            if ((sense > 0 && cmp > 0) || (sense < 0 && cmp < 0))
            {
                winner_idx = i;
                winner = ele;
            }
        }
    }

    /* remove gc protection and arguments */
    G_stk->discard(argc + 1);

    /* return the winning index (note: 1-based) or value, as desired */
    if (want_index)
        retval->set_int(winner_idx + 1);
    else
        *retval = winner;
        
    /* handled */
    return TRUE;
}